

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall
Reducer::Reducer(Reducer *this,string *command,string *test,string *working,bool binary,bool deNan,
                bool verbose,bool debugInfo,ToolOptions *toolOptions)

{
  bool debugInfo_local;
  bool verbose_local;
  bool deNan_local;
  bool binary_local;
  string *working_local;
  string *test_local;
  string *command_local;
  Reducer *this_local;
  
  wasm::WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>::
  WalkerPass(&this->
              super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
            );
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)&PTR__Reducer_001dfc50;
  std::__cxx11::string::string((string *)&this->command,(string *)command);
  std::__cxx11::string::string((string *)&this->test,(string *)test);
  std::__cxx11::string::string((string *)&this->working,(string *)working);
  this->binary = binary;
  this->deNan = deNan;
  this->verbose = verbose;
  this->debugInfo = debugInfo;
  this->toolOptions = toolOptions;
  std::unique_ptr<wasm::Module,std::default_delete<wasm::Module>>::
  unique_ptr<std::default_delete<wasm::Module>,void>
            ((unique_ptr<wasm::Module,std::default_delete<wasm::Module>> *)&this->module);
  std::unique_ptr<wasm::Builder,std::default_delete<wasm::Builder>>::
  unique_ptr<std::default_delete<wasm::Builder>,void>
            ((unique_ptr<wasm::Builder,std::default_delete<wasm::Builder>> *)&this->builder);
  this->decisionCounter = 0;
  return;
}

Assistant:

Reducer(std::string command,
          std::string test,
          std::string working,
          bool binary,
          bool deNan,
          bool verbose,
          bool debugInfo,
          ToolOptions& toolOptions)
    : command(command), test(test), working(working), binary(binary),
      deNan(deNan), verbose(verbose), debugInfo(debugInfo),
      toolOptions(toolOptions) {}